

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RiemannR.cpp
# Opt level: O0

longdouble * anon_unknown.dwarf_14c159::RiemannR<long_double>(longdouble x)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  int iVar5;
  longdouble *in_RAX;
  longdouble *extraout_RAX;
  size_t sVar6;
  undefined4 extraout_var;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble in_ST5;
  longdouble lVar9;
  double __x;
  longdouble in_stack_00000008;
  longdouble old_sum;
  uint k;
  longdouble logx;
  longdouble term;
  longdouble sum;
  longdouble epsilon;
  uint local_6c;
  
  if ((longdouble)1e-05 <= in_stack_00000008) {
    lVar8 = in_ST5;
    std::numeric_limits<long_double>::epsilon();
    lVar9 = lVar8;
    std::log(__x);
    local_6c = 1;
    in_RAX = extraout_RAX;
    while (local_6c < 1000) {
      iVar5 = 0x1dd0d0;
      sVar6 = primesieve::Array<long_double,_128UL>::size
                        ((Array<long_double,_128UL> *)(anonymous_namespace)::zeta);
      lVar7 = in_ST2;
      lVar1 = in_ST3;
      lVar2 = in_ST4;
      lVar3 = in_ST5;
      lVar4 = lVar8;
      if (local_6c + 1 < sVar6) {
        iVar5 = 0x1dd0d0;
        primesieve::Array<long_double,_128UL>::operator[]
                  ((Array<long_double,_128UL> *)(anonymous_namespace)::zeta,(ulong)(local_6c + 1));
        lVar7 = in_ST2;
        lVar1 = in_ST3;
        lVar2 = in_ST4;
        lVar3 = in_ST5;
        lVar4 = lVar8;
        lVar9 = lVar8;
      }
      lVar8 = lVar9;
      in_ST5 = lVar4;
      in_ST4 = lVar3;
      in_ST3 = lVar2;
      in_ST2 = lVar1;
      lVar9 = lVar8;
      iVar5 = std::abs(iVar5);
      if (lVar7 <= in_ST0) {
        return (longdouble *)CONCAT44(extraout_var,iVar5);
      }
      local_6c = local_6c + 1;
      in_RAX = (longdouble *)(ulong)local_6c;
    }
  }
  return in_RAX;
}

Assistant:

T RiemannR(T x)
{
  if (x < T(1e-5))
    return 0;

  T epsilon = pstd::numeric_limits<T>::epsilon();
  T sum = 1;
  T term = 1;
  T logx = std::log(x);

  // The condition k < ITERS is required in case the computation
  // does not converge. This happened on Linux i386 where
  // the precision of the libc math functions is very limited.
  for (unsigned k = 1; k < 1000; k++)
  {
    term *= logx / k;
    T old_sum = sum;

    if (k + 1 < zeta.size())
      sum += term / (T(zeta[k + 1]) * k);
    else
      // For k >= 127, approximate zeta(k + 1) by 1
      sum += term / k;

    // Not converging anymore
    if (std::abs(sum - old_sum) <= epsilon)
      break;
  }

  return sum;
}